

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmessage.cpp
# Opt level: O0

void __thiscall QDBusMessage::QDBusMessage(QDBusMessage *this)

{
  Data *pDVar1;
  QDBusMessagePrivate *in_RDI;
  
  pDVar1 = (Data *)operator_new(0xc0);
  QDBusMessagePrivate::QDBusMessagePrivate(in_RDI);
  (in_RDI->arguments).d.d = pDVar1;
  return;
}

Assistant:

QDBusMessage::QDBusMessage()
{
    d_ptr = new QDBusMessagePrivate;
}